

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O2

void c219_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  short sVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint *puVar11;
  ushort uVar12;
  int iVar13;
  uint uVar14;
  byte *pbVar15;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  lVar2 = *(long *)((long)param + 0x18);
  if (lVar2 != 0) {
    for (uVar6 = 0; uVar6 != samples; uVar6 = uVar6 + 1) {
      iVar10 = 0;
      iVar8 = 0;
      puVar11 = (uint *)((long)param + 0x424);
      pbVar15 = (byte *)((long)param + 0x25);
      for (uVar9 = 0; uVar9 != 0x10; uVar9 = uVar9 + 1) {
        if (((char)puVar11[6] != '\0') && (*(char *)((long)puVar11 + 0x19) == '\0')) {
          uVar14 = (uint)(ushort)puVar11[1] +
                   (uint)(ushort)(*(ushort *)(pbVar15 + -3) << 8 | *(ushort *)(pbVar15 + -3) >> 8);
          *(short *)(puVar11 + 1) = (short)uVar14;
          if (uVar14 < 0x10000) {
            uVar12 = *(ushort *)((long)puVar11 + 6);
            sVar7 = (short)puVar11[2];
            bVar5 = *pbVar15;
          }
          else {
            sVar7 = *(short *)((long)puVar11 + 6);
            *(short *)(puVar11 + 2) = sVar7;
            bVar5 = *pbVar15;
            if ((bVar5 & 4) == 0) {
              bVar1 = *(byte *)(lVar2 + (ulong)(((uint)*(byte *)((long)param +
                                                                (ulong)*(ushort *)
                                                                        ((long)&
                                                  find_sample_asic219banks +
                                                  (uVar9 >> 2 & 0x3fffffff) * 2) + 0x20) << 0x11 |
                                                *puVar11) & *(uint *)((long)param + 0x10)));
              if ((bVar5 & 1) == 0) {
                uVar12 = (ushort)bVar1 << 8;
              }
              else {
                uVar12 = *(ushort *)((long)param + (ulong)bVar1 * 2 + 0x222);
              }
              *(ushort *)((long)puVar11 + 6) = uVar12;
              uVar4 = *puVar11 + 1;
              *puVar11 = uVar4;
              if (uVar4 == puVar11[4]) {
                if ((bVar5 & 0x10) == 0) {
                  *(undefined1 *)(puVar11 + 6) = 0;
                  *(undefined2 *)((long)puVar11 + 6) = 0;
                  uVar12 = 0;
                }
                else {
                  *puVar11 = puVar11[5];
                }
              }
            }
            else {
              uVar12 = -(*(ushort *)((long)param + 0x220) & 1) & 0xfff6 ^
                       *(ushort *)((long)param + 0x220) >> 1;
              *(ushort *)((long)param + 0x220) = uVar12;
              *(ushort *)((long)puVar11 + 6) = uVar12;
            }
          }
          iVar13 = (int)((long)((int)(short)uVar12 - (int)sVar7) * (ulong)(uVar14 & 0xffff) >> 0x10)
                   + (int)sVar7;
          iVar3 = -iVar13;
          if ((bVar5 & 0x40) == 0) {
            iVar3 = iVar13;
          }
          iVar10 = iVar10 + (uint)pbVar15[-4] * iVar13;
          iVar8 = iVar8 + (uint)pbVar15[-5] * iVar3;
        }
        pbVar15 = pbVar15 + 0x10;
        puVar11 = puVar11 + 7;
      }
      (*outputs)[uVar6] = (*outputs)[uVar6] + (iVar10 >> 9);
      outputs[1][uVar6] = outputs[1][uVar6] + (iVar8 >> 9);
    }
  }
  return;
}

Assistant:

static void c219_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	c219_state *chip = (c219_state *)param;
	UINT32 i, j;

	DEV_SMPL out[2];

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (chip->pRom == NULL)
		return;

	for (i = 0; i < samples; i ++)
	{
		out[0] = out[1] = 0;

		for (j = 0; j < MAX_VOICE; j ++)
		{
			C219_VOICE* v = &chip->voi[j];
			const C219_VREGS* vreg = (C219_VREGS*)&chip->REG[j*16];

			if (v->key && ! v->Muted)
			{
				UINT32 frequency = (vreg->frequency_msb<<8) | vreg->frequency_lsb;
				INT32 newofs;
				INT32 s;

				newofs = v->pofs + frequency;
				v->pofs = newofs & 0xFFFF;
				if (newofs & 0x10000)
					c219_fetch_sample(chip, j);

				// Interpolate samples
				s = v->last_sample + (INT32)((INT64)v->pofs * (v->sample - v->last_sample) >> 16);

				if (vreg->mode & C219_MODE_INVERT)
					s = -s;
				out[0] += (((vreg->mode & C219_MODE_INVERT) ? -s : s) * vreg->volume_left);
				out[1] += (s * vreg->volume_right);
			}
		}

		outputs[0][i] += (out[0] >> 9);
		outputs[1][i] += (out[1] >> 9);
	}
}